

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::HeapType> * __thiscall
wasm::Random::FeatureOptions<wasm::HeapType>::add<>
          (FeatureOptions<wasm::HeapType> *this,FeatureSet feature,HeapType option)

{
  mapped_type *this_00;
  FeatureOptions<wasm::HeapType> *pFVar1;
  FeatureOptions<wasm::HeapType> *this_local;
  HeapType option_local;
  FeatureSet feature_local;
  
  this_local = (FeatureOptions<wasm::HeapType> *)option.id;
  option_local.id._4_4_ = feature.features;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&option_local.id + 4));
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back
            (this_00,(value_type *)&this_local);
  pFVar1 = add(this,option_local.id._4_4_);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }